

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_> *
__thiscall
burst::detail::
apply_impl<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>&,0ul,1ul,2ul>
          (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
           *__return_storage_ptr__,undefined8 param_2,long *f)

{
  initializer_list<boost::iterator_range<const_int_*>_> __l;
  allocator_type local_39;
  iterator_range<const_int_*> local_38;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38.super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       *(int **)f[2];
  local_38.super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       local_38.
       super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
       + ((long *)f[2])[1];
  local_28 = *(long *)f[1];
  local_20 = local_28 + ((long *)f[1])[1] * 4;
  local_18 = *(long *)*f;
  local_10 = local_18 + ((long *)*f)[1] * 4;
  __l._M_len = 3;
  __l._M_array = &local_38;
  std::
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>::
  vector(__return_storage_ptr__,__l,&local_39);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            apply_impl
            (
                NaryFunction && f,
                Tuple && t,
                std::index_sequence<Indices...>
            )
        {
            return invoke(std::forward<NaryFunction>(f), std::get<Indices>(std::forward<Tuple>(t))...);
        }